

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

int neverbleed_load_private_key_file(neverbleed_t *nb,SSL_CTX *ctx,char *fn,char *errbuf)

{
  uint nid;
  undefined8 uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  st_neverbleed_thread_data_t *psVar5;
  size_t sVar6;
  void *pvVar7;
  undefined8 *puVar8;
  RSA *r;
  EVP_PKEY *pkey;
  EC_POINT *pub;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  size_t *psVar12;
  EC_GROUP *pEVar13;
  EC_GROUP *str;
  size_t __n;
  EC_GROUP *str_00;
  EC_GROUP *pEVar14;
  BIGNUM *pBVar15;
  char *pcVar16;
  long lVar17;
  BIGNUM *e;
  expbuf_t buf;
  long lStack_d8;
  iovec iStack_d0;
  long lStack_c0;
  long lStack_b8;
  undefined8 uStack_b0;
  EC_GROUP *pEStack_a8;
  size_t sStack_a0;
  RSA *pRStack_98;
  EC_GROUP *pEStack_90;
  BIGNUM *local_80;
  expbuf_t local_78;
  char *local_50;
  neverbleed_t *local_48;
  BIGNUM *local_40;
  SSL_CTX *local_38;
  
  pEStack_90 = (EC_GROUP *)0x18a6d6;
  local_50 = errbuf;
  local_48 = nb;
  local_38 = (SSL_CTX *)ctx;
  psVar5 = get_thread_data(nb);
  local_78.end = (char *)0x0;
  local_78.capacity = 0;
  local_78.buf = (char *)0x0;
  local_78.start = (char *)0x0;
  pEStack_90 = (EC_GROUP *)0x18a6f6;
  expbuf_reserve(&local_78,9);
  builtin_strncpy(local_78.end,"load_key",9);
  local_78.end = local_78.end + 9;
  pEStack_90 = (EC_GROUP *)0x18a71b;
  sVar6 = strlen(fn);
  pEStack_90 = (EC_GROUP *)0x18a72d;
  expbuf_reserve(&local_78,sVar6 + 1);
  r = (RSA *)local_78.end;
  pEStack_90 = (EC_GROUP *)0x18a73f;
  memcpy(local_78.end,fn,sVar6 + 1);
  local_78.end = (char *)((long)&r->pad + sVar6 + 1);
  pEStack_90 = (EC_GROUP *)0x18a757;
  iVar3 = expbuf_write(&local_78,psVar5->fd);
  if (iVar3 == 0) {
    pEStack_90 = (EC_GROUP *)0x18a76c;
    expbuf_dispose(&local_78);
    pEStack_90 = (EC_GROUP *)0x18a779;
    iVar3 = expbuf_read(&local_78,psVar5->fd);
    pcVar16 = local_78.end;
    if (iVar3 == 0) {
      pEVar13 = (EC_GROUP *)local_78.start;
      if (7 < (ulong)((long)local_78.end - (long)local_78.start)) {
        pEVar13 = (EC_GROUP *)(local_78.start + 8);
        if (7 < (ulong)((long)local_78.end - (long)pEVar13)) {
          uVar1 = *(undefined8 *)pEVar13;
          str = (EC_GROUP *)(local_78.start + 0x10);
          __n = (long)local_78.end - (long)str;
          if (*(long *)local_78.start == 2) {
            pEVar13 = str;
            if (7 < __n) {
              nid = *(uint *)str;
              str_00 = (EC_GROUP *)(ulong)nid;
              str = (EC_GROUP *)(local_78.start + 0x18);
              iVar3 = 0;
              pEStack_90 = (EC_GROUP *)0x18a836;
              local_78.start = (char *)str;
              pvVar7 = memchr(str,0,(long)local_78.end - (long)str);
              if (pvVar7 == (void *)0x0) {
                str = (EC_GROUP *)0x0;
              }
              else {
                local_78.start = (char *)((long)pvVar7 + 1);
              }
              pEVar13 = (EC_GROUP *)local_78.start;
              if (str != (EC_GROUP *)0x0) {
                local_80 = (BIGNUM *)0x0;
                pEStack_90 = (EC_GROUP *)0x18a99d;
                puVar8 = (undefined8 *)malloc(0x10);
                if (puVar8 == (undefined8 *)0x0) {
LAB_0018ab06:
                  pEStack_90 = (EC_GROUP *)0x18ab0b;
                  neverbleed_load_private_key_file_cold_4();
LAB_0018ab0b:
                  pEStack_90 = (EC_GROUP *)0x18ab13;
                  neverbleed_load_private_key_file_cold_6();
LAB_0018ab13:
                  pEStack_90 = (EC_GROUP *)0x18ab18;
                  neverbleed_load_private_key_file_cold_3();
                  goto LAB_0018ab18;
                }
                *puVar8 = local_48;
                puVar8[1] = uVar1;
                pEStack_90 = (EC_GROUP *)0x18a9be;
                r = (RSA *)EC_KEY_new_method(local_48->engine);
                iVar3 = 0;
                pEStack_90 = (EC_GROUP *)0x18a9ce;
                EC_KEY_set_ex_data(r,0,puVar8);
                pEStack_90 = (EC_GROUP *)0x18a9d5;
                pEVar13 = EC_GROUP_new_by_curve_name(nid);
                if (pEVar13 == (EC_GROUP *)0x0) goto LAB_0018ab13;
                pEStack_90 = (EC_GROUP *)0x18a9ec;
                EC_KEY_set_group((EC_KEY *)r,pEVar13);
                pEStack_90 = (EC_GROUP *)0x18a9f9;
                pEVar14 = str;
                iVar4 = BN_hex2bn(&local_80,(char *)str);
                iVar3 = (int)pEVar14;
                if (iVar4 != 0) {
                  pEStack_90 = (EC_GROUP *)0x18aa12;
                  pBVar15 = local_80;
                  pEVar14 = pEVar13;
                  pub = EC_POINT_bn2point(pEVar13,local_80,(EC_POINT *)0x0,(BN_CTX *)0x0);
                  iVar3 = (int)pBVar15;
                  if (pub != (EC_POINT *)0x0) {
                    pEStack_90 = (EC_GROUP *)0x18aa29;
                    EC_KEY_set_public_key((EC_KEY *)r,pub);
                    pEStack_90 = (EC_GROUP *)0x18aa2e;
                    pkey = EVP_PKEY_new();
                    pEStack_90 = (EC_GROUP *)0x18aa3c;
                    EVP_PKEY_set1_EC_KEY(pkey,(ec_key_st *)r);
                    pEStack_90 = (EC_GROUP *)0x18aa44;
                    EC_POINT_free(pub);
                    pEStack_90 = (EC_GROUP *)0x18aa4e;
                    BN_free(local_80);
                    pEStack_90 = (EC_GROUP *)0x18aa56;
                    EC_GROUP_free(pEVar13);
                    pEStack_90 = (EC_GROUP *)0x18aa5e;
                    EC_KEY_free((EC_KEY *)r);
                    goto LAB_0018aa5e;
                  }
                  goto LAB_0018ab28;
                }
LAB_0018ab20:
                pEStack_90 = (EC_GROUP *)0x18ab28;
                pEVar14 = str;
                neverbleed_load_private_key_file_cold_2();
LAB_0018ab28:
                pEStack_90 = (EC_GROUP *)expbuf_write;
                neverbleed_load_private_key_file_cold_1();
                lStack_c0 = *(long *)(pEVar14 + 8);
                lStack_d8 = *(long *)(pEVar14 + 0x10) - lStack_c0;
                iStack_d0.iov_base = &lStack_d8;
                iStack_d0.iov_len = 8;
                lVar11 = 0;
                lVar17 = 0;
                lStack_b8 = lStack_d8;
                uStack_b0 = uVar1;
                pEStack_a8 = str;
                sStack_a0 = sVar6;
                pRStack_98 = r;
                pEStack_90 = str_00;
                do {
                  while (uVar9 = writev(iVar3,&iStack_d0 + lVar11,2 - (int)lVar17),
                        uVar9 == 0xffffffffffffffff) {
                    piVar10 = __errno_location();
                    if (*piVar10 != 4) {
                      return -1;
                    }
                  }
                  if (uVar9 == 0) {
                    __assert_fail("r != 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/neverbleed/neverbleed.c"
                                  ,0xfc,"int expbuf_write(struct expbuf_t *, int)");
                  }
                  lVar17 = (long)(int)lVar17;
                  psVar12 = &(&iStack_d0)[lVar17].iov_len;
                  do {
                    uVar2 = *psVar12;
                    if (uVar9 < uVar2) {
                      ((iovec *)(psVar12 + -1))->iov_base =
                           (void *)((long)((iovec *)(psVar12 + -1))->iov_base + uVar9);
                      *psVar12 = *psVar12 - uVar9;
                      break;
                    }
                    lVar17 = lVar17 + 1;
                    psVar12 = psVar12 + 2;
                    uVar9 = uVar9 - uVar2;
                  } while (uVar9 != 0);
                  lVar11 = (long)(int)lVar17;
                  if ((int)lVar17 == 2) {
                    return 0;
                  }
                } while( true );
              }
            }
          }
          else if (*(long *)local_78.start == 1) {
            pEStack_90 = (EC_GROUP *)0x18a7f5;
            local_78.start = (char *)str;
            pvVar7 = memchr(str,0,__n);
            if (pvVar7 == (void *)0x0) {
              str = (EC_GROUP *)0x0;
            }
            else {
              local_78.start = (char *)((long)pvVar7 + 1);
            }
            str_00 = (EC_GROUP *)local_78.start;
            pEVar13 = (EC_GROUP *)local_78.start;
            if (str != (EC_GROUP *)0x0) {
              iVar3 = 0;
              pEStack_90 = (EC_GROUP *)0x18a881;
              pvVar7 = memchr(local_78.start,0,(long)pcVar16 - (long)local_78.start);
              if (pvVar7 == (void *)0x0) {
                str_00 = (EC_GROUP *)0x0;
              }
              else {
                local_78.start = (char *)((long)pvVar7 + 1);
              }
              pEVar13 = (EC_GROUP *)local_78.start;
              if (str_00 != (EC_GROUP *)0x0) {
                local_80 = (BIGNUM *)0x0;
                local_40 = (BIGNUM *)0x0;
                pEStack_90 = (EC_GROUP *)0x18a8e2;
                puVar8 = (undefined8 *)malloc(0x10);
                if (puVar8 == (undefined8 *)0x0) {
                  pEStack_90 = (EC_GROUP *)0x18ab06;
                  neverbleed_load_private_key_file_cold_7();
                  goto LAB_0018ab06;
                }
                *puVar8 = local_48;
                puVar8[1] = uVar1;
                pEStack_90 = (EC_GROUP *)0x18a903;
                r = RSA_new_method((ENGINE *)local_48->engine);
                pEStack_90 = (EC_GROUP *)0x18a913;
                RSA_set_ex_data(r,0,puVar8);
                pEStack_90 = (EC_GROUP *)0x18a920;
                pEVar13 = str;
                iVar4 = BN_hex2bn(&local_80,(char *)str);
                iVar3 = (int)pEVar13;
                if (iVar4 == 0) goto LAB_0018ab0b;
                pEStack_90 = (EC_GROUP *)0x18a935;
                pEVar13 = str_00;
                iVar4 = BN_hex2bn(&local_40,(char *)str_00);
                iVar3 = (int)pEVar13;
                if (iVar4 != 0) {
                  pEStack_90 = (EC_GROUP *)0x18a951;
                  RSA_set0_key(r,local_40,local_80,0);
                  pEStack_90 = (EC_GROUP *)0x18a95e;
                  RSA_set_flags(r,0x20);
                  pEStack_90 = (EC_GROUP *)0x18a963;
                  pkey = EVP_PKEY_new();
                  pEStack_90 = (EC_GROUP *)0x18a971;
                  EVP_PKEY_set1_RSA(pkey,r);
                  pEStack_90 = (EC_GROUP *)0x18a979;
                  RSA_free(r);
LAB_0018aa5e:
                  pEStack_90 = (EC_GROUP *)0x18aa68;
                  expbuf_dispose(&local_78);
                  pEStack_90 = (EC_GROUP *)0x18aa75;
                  iVar3 = SSL_CTX_use_PrivateKey(local_38,pkey);
                  if (iVar3 != 1) {
                    builtin_strncpy(local_50,"SSL_CTX_use_PrivateKey failed",0x1e);
                  }
                  pEStack_90 = (EC_GROUP *)0x18aaa3;
                  EVP_PKEY_free(pkey);
                  return (uint)(iVar3 == 1);
                }
LAB_0018ab18:
                pEStack_90 = (EC_GROUP *)0x18ab20;
                neverbleed_load_private_key_file_cold_5();
                goto LAB_0018ab20;
              }
            }
          }
          else {
            pEStack_90 = (EC_GROUP *)0x18a851;
            local_78.start = (char *)str;
            pvVar7 = memchr(str,0,__n);
            if (pvVar7 == (void *)0x0) {
              str = (EC_GROUP *)0x0;
            }
            else {
              local_78.start = (char *)((long)pvVar7 + 1);
            }
            pEVar13 = (EC_GROUP *)local_78.start;
            if (str != (EC_GROUP *)0x0) {
              pEStack_90 = (EC_GROUP *)0x18a8b7;
              snprintf(local_50,0x100,"%s",str);
              return -1;
            }
          }
        }
      }
      local_78.start = (char *)pEVar13;
      pEStack_90 = (EC_GROUP *)0x18aab9;
      piVar10 = __errno_location();
      *piVar10 = 0;
      pcVar16 = "failed to parse response";
      goto LAB_0018aafa;
    }
    pEStack_90 = (EC_GROUP *)0x18aae5;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    pcVar16 = "read error";
  }
  else {
    pEStack_90 = (EC_GROUP *)0x18aacd;
    piVar10 = __errno_location();
    iVar3 = *piVar10;
    pcVar16 = "write error";
  }
  if (iVar3 == 0) {
    pcVar16 = "connection closed by daemon";
  }
LAB_0018aafa:
  pEStack_90 = (EC_GROUP *)0x18ab01;
  dief(pcVar16);
}

Assistant:

int neverbleed_load_private_key_file(neverbleed_t *nb, SSL_CTX *ctx, const char *fn, char *errbuf)
{
    struct st_neverbleed_thread_data_t *thdata = get_thread_data(nb);
    struct expbuf_t buf = {NULL};
    int ret = 1;
    size_t index, type;
    EVP_PKEY *pkey;

    expbuf_push_str(&buf, "load_key");
    expbuf_push_str(&buf, fn);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &type) != 0 || expbuf_shift_num(&buf, &index) != 0) {
        errno = 0;
        dief("failed to parse response");
    }

    switch (type) {
    case NEVERBLEED_TYPE_RSA: {
        char *estr, *nstr;

        if ((estr = expbuf_shift_str(&buf)) == NULL || (nstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = create_pkey(nb, index, estr, nstr);
        break;
    }
#if OPENSSL_1_1_API
    case NEVERBLEED_TYPE_ECDSA: {
        char *ec_pubkeystr;
        size_t curve_name;

        if (expbuf_shift_num(&buf, &curve_name) != 0 || (ec_pubkeystr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }
        pkey = ecdsa_create_pkey(nb, index, curve_name, ec_pubkeystr);
        break;
    }
#endif
    default: {
        char *errstr;

        if ((errstr = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            dief("failed to parse response");
        }

        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "%s", errstr);
        return -1;
    }
    }

    expbuf_dispose(&buf);

    /* success */
    if (SSL_CTX_use_PrivateKey(ctx, pkey) != 1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "SSL_CTX_use_PrivateKey failed");
        ret = 0;
    }

    EVP_PKEY_free(pkey);
    return ret;
}